

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_50(fglrx_ioctl_50 *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  bool bVar1;
  bool bVar2;
  
  fprintf(_stdout,"%skernel_ver_len: %d",fglrx_pfx,(ulong)d->kernel_ver_len);
  fglrx_pfx = ", ";
  if (d->_pad04 != 0) {
    fprintf(_stdout,"%s%s_pad04: 0x%08x%s",", ",colors->err,(ulong)d->_pad04,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->kernel_ver == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%skernel_ver: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%skernel_ver: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->kernel_ver,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024b749;
    }
    fputs(" [no data]",_stdout);
    buf = (mmt_buf *)0x0;
  }
LAB_0024b749:
  fglrx_pfx = ", ";
  bVar2 = true;
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk10 != 0) {
    fprintf(_stdout,"%sunk10: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk14 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk14: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk18 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk18: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk1c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk20 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk20: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk24 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk24: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk28 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk28: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk2c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk2c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk30 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk30: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk34 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk34: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk38 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk38: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk3c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk3c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk40 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk40: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk44 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk44: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk48 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk48: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk4c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk4c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk50 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk50: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk54 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk54: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf,"kernel_ver");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_50(struct fglrx_ioctl_50 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_d32(d, kernel_ver_len);
	fglrx_print_pad_x32(d, _pad04);
	struct mmt_buf *data1 = fglrx_print_ptr(d, kernel_ver, args, argc);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	fglrx_print_x32(d, unk20);
	fglrx_print_x32(d, unk24);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	fglrx_print_x32(d, unk30);
	fglrx_print_x32(d, unk34);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_x32(d, unk50);
	fglrx_print_x32(d, unk54);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "kernel_ver");
}